

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblock_test.c
# Opt level: O0

void reqthr(void *arg)

{
  int iVar1;
  undefined4 local_18;
  int rv;
  int query;
  nng_socket req;
  void *arg_local;
  
  rv = *arg;
  _query = arg;
  nng_dial((nng_socket)rv,addr,(nng_dialer *)0x0,2);
  local_18 = 0;
  while( true ) {
    iVar1 = nng_send((nng_socket)rv,&local_18,4,0);
    if (iVar1 == 7) break;
    nng_msleep(0x32);
  }
  return;
}

Assistant:

void
reqthr(void *arg)
{
	nng_socket req = *(nng_socket *) arg;

	nng_dial(req, addr, NULL, NNG_FLAG_NONBLOCK);

	int query = 0;
	// We just keep pounding out requests, no wait for response.
	for (;;) {
		int rv;
		rv = nng_send(req, &query, sizeof(query), 0);
		if (rv == NNG_ECLOSED) {
			return;
		}
		nng_msleep(50);
	}
}